

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_write_pcm_frames_le(ma_dr_wav *pWav,ma_uint64 framesToWrite,void *pData)

{
  size_t sVar1;
  size_t bytesToWrite;
  long lVar2;
  
  if (pData == (void *)0x0 || (framesToWrite == 0 || pWav == (ma_dr_wav *)0x0)) {
    return 0;
  }
  lVar2 = 0;
  for (bytesToWrite = (ulong)pWav->bitsPerSample * pWav->channels * framesToWrite >> 3;
      bytesToWrite != 0; bytesToWrite = bytesToWrite - sVar1) {
    sVar1 = ma_dr_wav_write_raw(pWav,bytesToWrite,pData);
    if (sVar1 == 0) break;
    lVar2 = lVar2 + sVar1;
    pData = (void *)((long)pData + sVar1);
  }
  return ((ulong)(lVar2 << 3) / (ulong)pWav->bitsPerSample) / (ulong)pWav->channels;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_write_pcm_frames_le(ma_dr_wav* pWav, ma_uint64 framesToWrite, const void* pData)
{
    ma_uint64 bytesToWrite;
    ma_uint64 bytesWritten;
    const ma_uint8* pRunningData;
    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > MA_SIZE_MAX) {
        return 0;
    }
    bytesWritten = 0;
    pRunningData = (const ma_uint8*)pData;
    while (bytesToWrite > 0) {
        size_t bytesJustWritten;
        ma_uint64 bytesToWriteThisIteration;
        bytesToWriteThisIteration = bytesToWrite;
        MA_DR_WAV_ASSERT(bytesToWriteThisIteration <= MA_SIZE_MAX);
        bytesJustWritten = ma_dr_wav_write_raw(pWav, (size_t)bytesToWriteThisIteration, pRunningData);
        if (bytesJustWritten == 0) {
            break;
        }
        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }
    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}